

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O2

void __thiscall
sf::RenderTarget::draw
          (RenderTarget *this,Vertex *vertices,size_t vertexCount,PrimitiveType type,
          RenderStates *states)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  PFNGLENABLECLIENTSTATEPROC *pp_Var4;
  Vector2f *pVVar5;
  Vertex *right;
  size_t sVar6;
  Vector2f VVar7;
  
  if (vertexCount == 0 || vertices == (Vertex *)0x0) {
    return;
  }
  bVar2 = anon_unknown.dwarf_42c354::RenderTargetImpl::isActive(this->m_id);
  if ((!bVar2) && (iVar3 = (*this->_vptr_RenderTarget[4])(this,1), (char)iVar3 == '\0')) {
    return;
  }
  if (vertexCount < 5) {
    pVVar5 = (Vector2f *)&(this->m_cache).field_0x38;
    right = vertices;
    sVar6 = vertexCount;
    while (bVar2 = sVar6 != 0, sVar6 = sVar6 - 1, bVar2) {
      VVar7 = operator*(&states->transform,&right->position);
      *(Vector2f *)&pVVar5[-2].y = VVar7;
      pVVar5[-1].y = (float)right->color;
      *pVVar5 = right->texCoords;
      pVVar5 = (Vector2f *)&pVVar5[2].y;
      right = right + 1;
    }
  }
  setupDraw(this,vertexCount < 5,states);
  bVar2 = states->shader != (Shader *)0x0;
  bVar1 = states->texture != (Texture *)0x0;
  if (((this->m_cache).enable != true) ||
     ((this->m_cache).texCoordsArrayEnabled != (bVar2 || bVar1))) {
    if (bVar2 || bVar1) {
      pp_Var4 = &sf_glad_glEnableClientState;
    }
    else {
      pp_Var4 = &sf_glad_glDisableClientState;
    }
    (**pp_Var4)(0x8078);
  }
  if (((vertexCount < 5) && ((this->m_cache).enable != false)) &&
     ((this->m_cache).useVertexCache != false)) {
    if ((!bVar2 && !bVar1) || ((this->m_cache).texCoordsArrayEnabled != false)) goto LAB_001a54f4;
    pVVar5 = (Vector2f *)&(this->m_cache).field_0x38;
  }
  else {
    if (vertexCount < 5) {
      vertices = (Vertex *)&(this->m_cache).field_0x2c;
    }
    (*sf_glad_glVertexPointer)(2,0x1406,0x14,vertices);
    (*sf_glad_glColorPointer)(4,0x1401,0x14,&vertices->color);
    if (!bVar2 && !bVar1) goto LAB_001a54f4;
    pVVar5 = &vertices->texCoords;
  }
  (*sf_glad_glTexCoordPointer)(2,0x1406,0x14,pVVar5);
LAB_001a54f4:
  (*sf_glad_glDrawArrays)(drawPrimitives::modes[type],0,(GLsizei)vertexCount);
  cleanupDraw(this,states);
  (this->m_cache).useVertexCache = vertexCount < 5;
  (this->m_cache).texCoordsArrayEnabled = bVar2 || bVar1;
  return;
}

Assistant:

void RenderTarget::draw(const Vertex* vertices, std::size_t vertexCount,
                        PrimitiveType type, const RenderStates& states)
{
    // Nothing to draw?
    if (!vertices || (vertexCount == 0))
        return;

    // GL_QUADS is unavailable on OpenGL ES
    #ifdef SFML_OPENGL_ES
        if (type == Quads)
        {
            err() << "sf::Quads primitive type is not supported on OpenGL ES platforms, drawing skipped" << std::endl;
            return;
        }
    #endif

    if (RenderTargetImpl::isActive(m_id) || setActive(true))
    {
        // Check if the vertex count is low enough so that we can pre-transform them
        bool useVertexCache = (vertexCount <= StatesCache::VertexCacheSize);

        if (useVertexCache)
        {
            // Pre-transform the vertices and store them into the vertex cache
            for (std::size_t i = 0; i < vertexCount; ++i)
            {
                Vertex& vertex = m_cache.vertexCache[i];
                vertex.position = states.transform * vertices[i].position;
                vertex.color = vertices[i].color;
                vertex.texCoords = vertices[i].texCoords;
            }
        }

        setupDraw(useVertexCache, states);

        // Check if texture coordinates array is needed, and update client state accordingly
        bool enableTexCoordsArray = (states.texture || states.shader);
        if (!m_cache.enable || (enableTexCoordsArray != m_cache.texCoordsArrayEnabled))
        {
            if (enableTexCoordsArray)
                glCheck(glEnableClientState(GL_TEXTURE_COORD_ARRAY));
            else
                glCheck(glDisableClientState(GL_TEXTURE_COORD_ARRAY));
        }

        // If we switch between non-cache and cache mode or enable texture
        // coordinates we need to set up the pointers to the vertices' components
        if (!m_cache.enable || !useVertexCache || !m_cache.useVertexCache)
        {
            const char* data = reinterpret_cast<const char*>(vertices);

            // If we pre-transform the vertices, we must use our internal vertex cache
            if (useVertexCache)
                data = reinterpret_cast<const char*>(m_cache.vertexCache);

            glCheck(glVertexPointer(2, GL_FLOAT, sizeof(Vertex), data + 0));
            glCheck(glColorPointer(4, GL_UNSIGNED_BYTE, sizeof(Vertex), data + 8));
            if (enableTexCoordsArray)
                glCheck(glTexCoordPointer(2, GL_FLOAT, sizeof(Vertex), data + 12));
        }
        else if (enableTexCoordsArray && !m_cache.texCoordsArrayEnabled)
        {
            // If we enter this block, we are already using our internal vertex cache
            const char* data = reinterpret_cast<const char*>(m_cache.vertexCache);

            glCheck(glTexCoordPointer(2, GL_FLOAT, sizeof(Vertex), data + 12));
        }

        drawPrimitives(type, 0, vertexCount);
        cleanupDraw(states);

        // Update the cache
        m_cache.useVertexCache = useVertexCache;
        m_cache.texCoordsArrayEnabled = enableTexCoordsArray;
    }
}